

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::CompilerGLSL::type_to_packed_alignment
          (CompilerGLSL *this,SPIRType *type,Bitset *flags,BufferPackingStandard packing)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  uint uVar1;
  Decoration *pDVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  mapped_type *pmVar6;
  SPIRType *type_00;
  CompilerError *this_01;
  BufferPackingStandard extraout_EDX;
  uint32_t uVar7;
  uint uVar8;
  CompilerGLSL *this_02;
  ulong uVar9;
  Bitset member_flags;
  _AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,_false>_>_> local_78;
  Bitset local_70;
  
  bVar3 = Compiler::is_physical_pointer(&this->super_Compiler,type);
  uVar7 = 0;
  if (!bVar3) {
    uVar7 = 0;
    do {
      this_02 = this;
      bVar3 = Compiler::is_array(&this->super_Compiler,type);
      if (!bVar3) {
        if (type->basetype == Struct) {
          if ((type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              buffer_size == 0) {
            uVar5 = 1;
          }
          else {
            this_00 = &local_70.higher;
            uVar8 = 1;
            uVar9 = 0;
            uVar5 = 1;
            do {
              pmVar6 = ::std::__detail::
                       _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&(this->super_Compiler).ir.meta,&(type->super_IVariant).self)
              ;
              pDVar2 = (pmVar6->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
              local_70.lower = pDVar2[uVar9].decoration_flags.lower;
              local_70.higher._M_h._M_buckets = (__buckets_ptr)0x0;
              local_70.higher._M_h._M_bucket_count =
                   pDVar2[uVar9].decoration_flags.higher._M_h._M_bucket_count;
              local_70.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              local_70.higher._M_h._M_element_count =
                   pDVar2[uVar9].decoration_flags.higher._M_h._M_element_count;
              local_70.higher._M_h._M_rehash_policy._M_max_load_factor =
                   pDVar2[uVar9].decoration_flags.higher._M_h._M_rehash_policy._M_max_load_factor;
              local_70.higher._M_h._M_rehash_policy._4_4_ =
                   *(undefined4 *)
                    &pDVar2[uVar9].decoration_flags.higher._M_h._M_rehash_policy.field_0x4;
              local_70.higher._M_h._M_rehash_policy._M_next_resize =
                   pDVar2[uVar9].decoration_flags.higher._M_h._M_rehash_policy._M_next_resize;
              local_70.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
              local_78._M_h = (__hashtable_alloc *)this_00;
              ::std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)this_00,&pDVar2[uVar9].decoration_flags.higher._M_h,&local_78);
              type_00 = Variant::get<spirv_cross::SPIRType>
                                  ((this->super_Compiler).ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   (type->member_types).
                                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                   ptr[uVar9].id);
              uVar4 = type_to_packed_alignment(this,type_00,&local_70,packing);
              if (uVar4 < uVar5) {
                uVar4 = uVar5;
              }
              uVar5 = uVar4;
              ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::~_Hashtable(&this_00->_M_h);
              uVar9 = (ulong)uVar8;
              uVar8 = uVar8 + 1;
            } while (uVar9 < (type->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                             buffer_size);
          }
          if (((packing < BufferPackingScalar) && ((0x35U >> (packing & 0x1f) & 1) != 0)) &&
             (uVar5 < 0x11)) {
            uVar5 = 0x10;
          }
          goto LAB_0012638f;
        }
        uVar5 = type_to_packed_base_size(this_02,type,extraout_EDX);
        if ((packing & ~BufferPackingStd430) == BufferPackingScalar) goto LAB_0012638f;
        uVar8 = type->columns;
        if (uVar8 == 1) {
          if (((packing & ~BufferPackingStd430) == BufferPackingHLSLCbuffer) ||
             (uVar1 = type->vecsize, uVar1 == 1)) goto LAB_0012638f;
        }
        else {
          uVar1 = type->vecsize;
        }
        if ((uVar1 == 4) || (uVar1 == 2)) {
          if (uVar8 != 1) goto LAB_00126579;
LAB_00126554:
          uVar5 = uVar5 * uVar1;
          goto LAB_0012638f;
        }
        if (uVar1 != 3 || uVar8 != 1) {
LAB_00126579:
          if (uVar8 < 2 || (flags->lower & 0x20) == 0) {
            if ((uVar1 < 2) || ((flags->lower & 0x10) == 0)) {
              this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (this_01,"Did not find suitable rule for type. Bogus decorations?");
              goto LAB_0012661c;
            }
            if (((BufferPackingHLSLCbufferPackOffset < packing) ||
                ((0x35U >> (packing & 0x1f) & 1) == 0)) && (uVar8 != 3)) {
              uVar5 = uVar5 * uVar8;
              goto LAB_0012638f;
            }
          }
          else if (((BufferPackingHLSLCbufferPackOffset < packing) ||
                   ((0x35U >> (packing & 0x1f) & 1) == 0)) && (uVar1 != 3)) goto LAB_00126554;
        }
        uVar5 = uVar5 << 2;
        goto LAB_0012638f;
      }
      uVar5 = 1;
      if (packing < BufferPackingScalar) {
        uVar5 = *(uint *)(&DAT_002b0554 + (ulong)packing * 4);
      }
      do {
        type = Variant::get<spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (type->parent_type).id);
      } while ((type->array).super_VectorView<unsigned_int>.buffer_size != 0);
      if (uVar7 < uVar5) {
        uVar7 = uVar5;
      }
      bVar3 = Compiler::is_physical_pointer(&this->super_Compiler,type);
    } while (!bVar3);
  }
  if (type->pointer == false) {
    this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_01,"Types in PhysicalStorageBufferEXT must be pointers.");
LAB_0012661c:
    __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((this->super_Compiler).ir.addressing_model != AddressingModelPhysicalStorageBuffer64) {
    this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_01,
               "AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT."
              );
    goto LAB_0012661c;
  }
  if ((packing < BufferPackingScalar) && ((0x35U >> (packing & 0x1f) & 1) != 0)) {
    bVar3 = Compiler::type_is_array_of_pointers(&this->super_Compiler,type);
    uVar5 = 0x10;
    if (bVar3) goto LAB_0012638f;
  }
  uVar5 = 8;
LAB_0012638f:
  if (uVar7 < uVar5) {
    uVar7 = uVar5;
  }
  return uVar7;
}

Assistant:

uint32_t CompilerGLSL::type_to_packed_alignment(const SPIRType &type, const Bitset &flags,
                                                BufferPackingStandard packing)
{
	// If using PhysicalStorageBufferEXT storage class, this is a pointer,
	// and is 64-bit.
	if (is_physical_pointer(type))
	{
		if (!type.pointer)
			SPIRV_CROSS_THROW("Types in PhysicalStorageBufferEXT must be pointers.");

		if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
		{
			if (packing_is_vec4_padded(packing) && type_is_array_of_pointers(type))
				return 16;
			else
				return 8;
		}
		else
			SPIRV_CROSS_THROW("AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT.");
	}
	else if (is_array(type))
	{
		uint32_t minimum_alignment = 1;
		if (packing_is_vec4_padded(packing))
			minimum_alignment = 16;

		auto *tmp = &get<SPIRType>(type.parent_type);
		while (!tmp->array.empty())
			tmp = &get<SPIRType>(tmp->parent_type);

		// Get the alignment of the base type, then maybe round up.
		return max(minimum_alignment, type_to_packed_alignment(*tmp, flags, packing));
	}

	if (type.basetype == SPIRType::Struct)
	{
		// Rule 9. Structs alignments are maximum alignment of its members.
		uint32_t alignment = 1;
		for (uint32_t i = 0; i < type.member_types.size(); i++)
		{
			auto member_flags = ir.meta[type.self].members[i].decoration_flags;
			alignment =
			    max(alignment, type_to_packed_alignment(get<SPIRType>(type.member_types[i]), member_flags, packing));
		}

		// In std140, struct alignment is rounded up to 16.
		if (packing_is_vec4_padded(packing))
			alignment = max<uint32_t>(alignment, 16u);

		return alignment;
	}
	else
	{
		const uint32_t base_alignment = type_to_packed_base_size(type, packing);

		// Alignment requirement for scalar block layout is always the alignment for the most basic component.
		if (packing_is_scalar(packing))
			return base_alignment;

		// Vectors are *not* aligned in HLSL, but there's an extra rule where vectors cannot straddle
		// a vec4, this is handled outside since that part knows our current offset.
		if (type.columns == 1 && packing_is_hlsl(packing))
			return base_alignment;

		// From 7.6.2.2 in GL 4.5 core spec.
		// Rule 1
		if (type.vecsize == 1 && type.columns == 1)
			return base_alignment;

		// Rule 2
		if ((type.vecsize == 2 || type.vecsize == 4) && type.columns == 1)
			return type.vecsize * base_alignment;

		// Rule 3
		if (type.vecsize == 3 && type.columns == 1)
			return 4 * base_alignment;

		// Rule 4 implied. Alignment does not change in std430.

		// Rule 5. Column-major matrices are stored as arrays of
		// vectors.
		if (flags.get(DecorationColMajor) && type.columns > 1)
		{
			if (packing_is_vec4_padded(packing))
				return 4 * base_alignment;
			else if (type.vecsize == 3)
				return 4 * base_alignment;
			else
				return type.vecsize * base_alignment;
		}

		// Rule 6 implied.

		// Rule 7.
		if (flags.get(DecorationRowMajor) && type.vecsize > 1)
		{
			if (packing_is_vec4_padded(packing))
				return 4 * base_alignment;
			else if (type.columns == 3)
				return 4 * base_alignment;
			else
				return type.columns * base_alignment;
		}

		// Rule 8 implied.
	}

	SPIRV_CROSS_THROW("Did not find suitable rule for type. Bogus decorations?");
}